

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layeredopacity.h
# Opt level: O1

void __thiscall LayeredOpacity::initialize(LayeredOpacity *this)

{
  vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
  **ppvVar1;
  byte bVar2;
  RootWindow *pRVar3;
  undefined1 auVar4 [16];
  TransformNode *this_00;
  Node *child;
  Node *pNVar5;
  float *pfVar6;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  float fVar7;
  float fVar8;
  rect2d rect;
  vec4 color;
  rect2d rect_00;
  vec4 color_00;
  vec4 color_01;
  shared_ptr<rengine::AbstractAnimation> local_88;
  float local_78;
  float fStack_74;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>
  *local_40;
  shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>_>
  anim;
  
  (*((((this->super_Example).m_window)->super_StandardSurface).super_Surface.m_impl)->
    _vptr_SurfaceBackendImpl[6])();
  local_58 = extraout_XMM0_Da / 3.0;
  local_78 = extraout_XMM0_Db / 3.0;
  fStack_74 = extraout_XMM0_Db;
  local_68 = extraout_XMM0_Db;
  fStack_54 = extraout_XMM0_Db;
  this_00 = rengine::TransformNode::create();
  *(undefined8 *)&(this_00->super_Node).field_0x34 = 0x3f800000;
  *(undefined4 *)&this_00->field_0x3c = 0;
  *(float *)&this_00->field_0x40 = extraout_XMM0_Da * 0.5;
  *(undefined8 *)&this_00->field_0x44 = 0x3f80000000000000;
  *(undefined4 *)&this_00->field_0x4c = 0;
  *(float *)&this_00->field_0x50 = local_68 * 0.5;
  *(undefined8 *)&this_00->field_0x54 = 0;
  *(undefined4 *)&this_00->field_0x5c = 0x3f800000;
  *(undefined8 *)&this_00->field_0x60 = 0;
  *(undefined8 *)&this_00->field_0x68 = 0;
  *(undefined8 *)&this_00->field_0x70 = 0x13f800000;
  child = &rengine::OpacityNode::create()->super_Node;
  rengine::Node::append(&this_00->super_Node,child);
  local_68 = local_58 - local_58;
  fStack_64 = local_78 - local_78;
  fStack_60 = fStack_54;
  fStack_5c = fStack_74;
  pNVar5 = (Node *)rengine::RectangleNode::create();
  rect.br.y = fStack_64;
  rect.br.x = local_68;
  rect.tl = (vec2)(CONCAT44(local_78,local_58) ^ 0x8000000080000000);
  rengine::RectangleNodeBase::setGeometry((RectangleNodeBase *)pNVar5,rect);
  color.z = 0.8;
  color.w = 1.0;
  color.x = 0.5;
  color.y = 0.5;
  rengine::RectangleNode::setColor((RectangleNode *)pNVar5,color);
  rengine::Node::append(child,pNVar5);
  fVar7 = local_58 * -0.5;
  fVar8 = local_78 * -0.5;
  local_68 = local_58 + fVar7;
  fStack_64 = local_78 + fVar8;
  fStack_60 = fStack_54;
  fStack_5c = fStack_74;
  pNVar5 = (Node *)rengine::RectangleNode::create();
  rect_00.br.y = fStack_64;
  rect_00.br.x = local_68;
  rect_00.tl.y = fVar8;
  rect_00.tl.x = fVar7;
  rengine::RectangleNodeBase::setGeometry((RectangleNodeBase *)pNVar5,rect_00);
  color_00.z = 0.8;
  color_00.w = 1.0;
  color_00.x = 0.5;
  color_00.y = 0.5;
  rengine::RectangleNode::setColor((RectangleNode *)pNVar5,color_00);
  rengine::Node::append(child,pNVar5);
  local_58 = local_58 + 0.0;
  fStack_50 = fStack_54;
  fStack_4c = fStack_74;
  fStack_54 = local_78 + 0.0;
  pNVar5 = (Node *)rengine::RectangleNode::create();
  auVar4._4_4_ = fStack_54;
  auVar4._0_4_ = local_58;
  auVar4._8_8_ = 0;
  rengine::RectangleNodeBase::setGeometry((RectangleNodeBase *)pNVar5,(rect2d)(auVar4 << 0x40));
  color_01.z = 0.8;
  color_01.w = 1.0;
  color_01.x = 0.5;
  color_01.y = 0.5;
  rengine::RectangleNode::setColor((RectangleNode *)pNVar5,color_01);
  rengine::Node::append(child,pNVar5);
  local_40 = (Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>
              *)0x0;
  anim.
  super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)operator_new(0x58);
  ((anim.
    super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->super_AbstractAnimation).super_SignalEmitter.m_buckets =
       (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        *)0x100000001;
  ((anim.
    super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->super_AbstractAnimation).super_SignalEmitter._vptr_SignalEmitter =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00148c60;
  local_40 = (Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>
              *)&((anim.
                   super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super_AbstractAnimation).m_iterations;
  ((anim.
    super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->super_AbstractAnimation).m_duration = 0.0;
  *(undefined4 *)
   &((anim.
      super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
     ._M_ptr)->super_AbstractAnimation).field_0x20 = 1;
  (anim.
   super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr)->m_target = (OpacityNode *)0x3ff0000000000000;
  *(byte *)&((anim.
              super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->m_keyFrames).
            super__Vector_base<rengine::KeyFrame<float>,_std::allocator<rengine::KeyFrame<float>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
       *(byte *)&((anim.
                   super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->m_keyFrames).
                 super__Vector_base<rengine::KeyFrame<float>,_std::allocator<rengine::KeyFrame<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start & 0xf8;
  *(undefined ***)
   &((anim.
      super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
     ._M_ptr)->super_AbstractAnimation).m_iterations = &PTR__Animation_00148cb0;
  ((anim.
    super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->m_keyFrames).
  super__Vector_base<rengine::KeyFrame<float>,_std::allocator<rengine::KeyFrame<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)child;
  ((anim.
    super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->m_keyFrames).
  super__Vector_base<rengine::KeyFrame<float>,_std::allocator<rengine::KeyFrame<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  anim.
  super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr[1].super_AbstractAnimation.super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
  anim.
  super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr[1].super_AbstractAnimation.super_SignalEmitter.m_buckets =
       (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        *)0x0;
  bVar2 = *(byte *)&((anim.
                      super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->m_keyFrames).
                    super__Vector_base<rengine::KeyFrame<float>,_std::allocator<rengine::KeyFrame<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  if ((bVar2 & 1) == 0) {
    (anim.
     super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr)->m_target = (OpacityNode *)0x4008000000000000;
    *(byte *)&((anim.
                super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->m_keyFrames).
              super__Vector_base<rengine::KeyFrame<float>,_std::allocator<rengine::KeyFrame<float>_>_>
              ._M_impl.super__Vector_impl_data._M_start = bVar2 & 0xf8 | 4;
    *(undefined4 *)
     &((anim.
        super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr)->super_AbstractAnimation).field_0x20 = 0xffffffff;
    pfVar6 = rengine::
             Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>
             ::newKeyFrame(local_40,0.0);
    *pfVar6 = 1.0;
    pfVar6 = rengine::
             Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>
             ::newKeyFrame(local_40,1.0);
    *pfVar6 = 0.0;
    pRVar3 = (this->super_Example).m_window;
    local_88.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_40->super_AbstractAnimation;
    local_88.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            anim.
            super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
    if (anim.
        super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ppvVar1 = &((anim.
                     super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->super_AbstractAnimation).super_SignalEmitter.m_buckets;
        *(int *)ppvVar1 = *(int *)ppvVar1 + 1;
        UNLOCK();
      }
      else {
        ppvVar1 = &((anim.
                     super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->super_AbstractAnimation).super_SignalEmitter.m_buckets;
        *(int *)ppvVar1 = *(int *)ppvVar1 + 1;
      }
    }
    rengine::AnimationManager::start
              (&(pRVar3->super_StandardSurface).m_animationManager,&local_88,0.0);
    if ((element_type *)
        local_88.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    (this->m_animation).super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = &local_40->super_AbstractAnimation;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->m_animation).
                super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&anim);
    rengine::Node::append((Node *)this,&this_00->super_Node);
    if (anim.
        super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 anim.
                 super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
    }
    return;
  }
  __assert_fail("!isRunning()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/animationsystem/animation.h"
                ,0x6a,"void rengine::AbstractAnimation::setDuration(double)");
}

Assistant:

void initialize() override {
        vec2 s = size();
        vec2 s3 = s / 3;

        // Root has origin in screen center
        TransformNode *root = TransformNode::create();
        root->setMatrix(mat4::translate2D(s.x * 0.5, s.y * 0.5));

        OpacityNode *opacityNode = OpacityNode::create();
        root->append(opacityNode);

        vec4 color(0.5, 0.5, 0.8, 1.0);

        *opacityNode << RectangleNode::create(rect2d::fromPosSize(-s3, s3), color)
                     << RectangleNode::create(rect2d::fromPosSize(-s3/2, s3), color)
                     << RectangleNode::create(rect2d::fromPosSize(vec2(), s3), color);

        auto anim = std::make_shared<Animation_OpacityNode_opacity>(opacityNode);
        anim->setDuration(3);
        anim->setDirection(AbstractAnimation::Alternate);
        anim->setIterations(-1);
        anim->newKeyFrame(0) = 1;
        anim->newKeyFrame(1) = 0;

        animationManager()->start(anim);

        m_animation = anim;

        append(root);
    }